

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_359b51::BuildEngineImpl::demandRule(BuildEngineImpl *this,RuleInfo *ruleInfo)

{
  bool bVar1;
  int iVar2;
  pointer pRVar3;
  undefined4 extraout_var;
  pointer ppVar4;
  pointer this_00;
  pointer task_00;
  uint64_t uVar5;
  pair<std::__detail::_Node_iterator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false,_false>,_bool>
  pVar6;
  undefined1 local_108 [8];
  TaskInterface iface_1;
  TracingEngineTaskCallback i_1;
  undefined1 local_e0 [8];
  TaskInterface iface;
  TracingEngineTaskCallback i;
  TaskInfo *taskInfo;
  TaskInfo local_b0;
  _Node_iterator_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
  local_38;
  pair<std::__detail::_Node_iterator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false,_false>,_bool>
  result;
  Task *task;
  RuleInfo *ruleInfo_local;
  BuildEngineImpl *this_local;
  
  bVar1 = RuleInfo::isScanned(ruleInfo,this);
  if (!bVar1) {
    __assert_fail("ruleInfo.isScanned(this)",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                  ,0x20c,"bool (anonymous namespace)::BuildEngineImpl::demandRule(RuleInfo &)");
  }
  bVar1 = RuleInfo::isComplete(ruleInfo,this);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = RuleInfo::isInProgress(ruleInfo);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else if (ruleInfo->state == DoesNotNeedToRun) {
      RuleInfo::setComplete(ruleInfo,this);
      pRVar3 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
               operator->(&ruleInfo->rule);
      (*pRVar3->_vptr_Rule[4])(pRVar3,this->buildEngine,1);
      this_local._7_1_ = true;
    }
    else {
      if (ruleInfo->state != NeedsToRun) {
        __assert_fail("ruleInfo.state == RuleInfo::StateKind::NeedsToRun",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                      ,0x222,"bool (anonymous namespace)::BuildEngineImpl::demandRule(RuleInfo &)");
      }
      pRVar3 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
               operator->(&ruleInfo->rule);
      iVar2 = (*pRVar3->_vptr_Rule[2])(pRVar3,this->buildEngine);
      result._8_8_ = CONCAT44(extraout_var,iVar2);
      if (result._8_8_ == 0) {
        __assert_fail("task && \"rule action returned null task\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                      ,0x226,"bool (anonymous namespace)::BuildEngineImpl::demandRule(RuleInfo &)");
      }
      std::mutex::lock(&this->taskInfosMutex);
      TaskInfo::TaskInfo(&local_b0,(Task *)result._8_8_);
      pVar6 = std::
              unordered_map<llbuild::core::Task*,(anonymous_namespace)::BuildEngineImpl::TaskInfo,std::hash<llbuild::core::Task*>,std::equal_to<llbuild::core::Task*>,std::allocator<std::pair<llbuild::core::Task*const,(anonymous_namespace)::BuildEngineImpl::TaskInfo>>>
              ::emplace<llbuild::core::Task*&,(anonymous_namespace)::BuildEngineImpl::TaskInfo>
                        ((unordered_map<llbuild::core::Task*,(anonymous_namespace)::BuildEngineImpl::TaskInfo,std::hash<llbuild::core::Task*>,std::equal_to<llbuild::core::Task*>,std::allocator<std::pair<llbuild::core::Task*const,(anonymous_namespace)::BuildEngineImpl::TaskInfo>>>
                          *)&this->taskInfos,(Task **)&result.second,&local_b0);
      local_38._M_cur =
           (__node_type *)
           pVar6.first.
           super__Node_iterator_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
           ._M_cur;
      result.first.
      super__Node_iterator_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
      ._M_cur._0_1_ = pVar6.second;
      TaskInfo::~TaskInfo(&local_b0);
      if (((byte)result.first.
                 super__Node_iterator_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
                 ._M_cur & 1) == 0) {
        __assert_fail("result.second && \"task already registered\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                      ,0x22b,"bool (anonymous namespace)::BuildEngineImpl::demandRule(RuleInfo &)");
      }
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false,_false>
               ::operator->((_Node_iterator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false,_false>
                             *)&local_38);
      i.key = (uint64_t)&ppVar4->second;
      std::mutex::unlock(&this->taskInfosMutex);
      *(RuleInfo **)(i.key + 0x38) = ruleInfo;
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
      if (bVar1) {
        this_00 = std::
                  unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                  ::operator->(&this->trace);
        task_00 = std::unique_ptr<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_>::
                  get((unique_ptr<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_> *)
                      i.key);
        pRVar3 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                 get(&ruleInfo->rule);
        llbuild::core::BuildEngineTrace::createdTaskForRule(this_00,task_00,pRVar3);
      }
      ruleInfo->state = InProgressWaiting;
      RuleInfo::setPendingTaskInfo(ruleInfo,(TaskInfo *)i.key);
      llbuild::core::DependencyKeyIDs::clear(&(ruleInfo->result).dependencies);
      uVar5 = llbuild::core::KeyID::operator_cast_to_unsigned_long(&ruleInfo->keyID);
      llbuild::TracingEngineTaskCallback::TracingEngineTaskCallback
                ((TracingEngineTaskCallback *)&iface.ctx,Start,uVar5);
      llbuild::core::TaskInterface::TaskInterface
                ((TaskInterface *)local_e0,this,(void *)result._8_8_);
      (**(code **)(*(long *)result._8_8_ + 0x10))(result._8_8_,local_e0,iface.impl);
      llbuild::TracingEngineTaskCallback::~TracingEngineTaskCallback
                ((TracingEngineTaskCallback *)&iface.ctx);
      if ((ruleInfo->result).builtAt != 0) {
        pRVar3 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                 operator->(&ruleInfo->rule);
        bVar1 = llbuild::basic::CommandSignature::operator==
                          (&pRVar3->signature,&(ruleInfo->result).signature);
        if (bVar1) {
          uVar5 = llbuild::core::KeyID::operator_cast_to_unsigned_long(&ruleInfo->keyID);
          llbuild::TracingEngineTaskCallback::TracingEngineTaskCallback
                    ((TracingEngineTaskCallback *)&iface_1.ctx,ProvidePriorValue,uVar5);
          llbuild::core::TaskInterface::TaskInterface
                    ((TaskInterface *)local_108,this,(void *)result._8_8_);
          (**(code **)(*(long *)result._8_8_ + 0x18))
                    (result._8_8_,local_108,iface_1.impl,&ruleInfo->result);
          llbuild::TracingEngineTaskCallback::~TracingEngineTaskCallback
                    ((TracingEngineTaskCallback *)&iface_1.ctx);
        }
      }
      if (*(int *)(i.key + 0x40) == 0) {
        std::
        deque<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
        ::push_back(&this->readyTaskInfos,(value_type *)&i);
      }
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool demandRule(RuleInfo& ruleInfo) {
    // The rule must have already been scanned.
    assert(ruleInfo.isScanned(this));

    // If the rule is complete, we are done.
    if (ruleInfo.isComplete(this))
      return true;

    // If the rule is in progress, we don't need to do anything.
    if (ruleInfo.isInProgress())
      return false;

    // If the rule isn't marked complete, but doesn't need to actually run, then
    // just update it.
    if (ruleInfo.state == RuleInfo::StateKind::DoesNotNeedToRun) {
      ruleInfo.setComplete(this);

      // Report the status change.
      ruleInfo.rule->updateStatus(buildEngine, Rule::StatusKind::IsUpToDate);

      return true;
    }

    // Otherwise, we actually need to initiate the processing of this rule.
    assert(ruleInfo.state == RuleInfo::StateKind::NeedsToRun);

    // Create the task for this rule.
    Task* task = ruleInfo.rule->createTask(buildEngine);
    assert(task && "rule action returned null task");

    // register the task
    taskInfosMutex.lock();
    auto result = taskInfos.emplace(task, TaskInfo(task));
    assert(result.second && "task already registered");
    auto taskInfo = &(result.first)->second;
    taskInfosMutex.unlock();
    taskInfo->forRuleInfo = &ruleInfo;

    if (trace)
      trace->createdTaskForRule(taskInfo->task.get(), ruleInfo.rule.get());

    // Transition the rule state.
    ruleInfo.state = RuleInfo::StateKind::InProgressWaiting;
    ruleInfo.setPendingTaskInfo(taskInfo);

    // Reset the Rule Dependencies, which we just append to during processing,
    // but we reset the others to ensure no one ever inadvertently uses them
    // during an invalid state.
    ruleInfo.result.dependencies.clear();

    // Inform the task it should start.
    {
      TracingEngineTaskCallback i(EngineTaskCallbackKind::Start, ruleInfo.keyID);
      TaskInterface iface{this, task};
      task->start(iface);
    }

    // Provide the task the prior result, if present.
    //
    // FIXME: This should perhaps just be lumped in with the start call? Or
    // alternately, maybe there should just be an API call to fetch this, and
    // the clients that want it can ask? It's cheap to provide here, so
    // ultimately this is mostly a matter of cleanliness.
    if (ruleInfo.result.builtAt != 0 &&
        ruleInfo.rule->signature == ruleInfo.result.signature) {
      TracingEngineTaskCallback i(EngineTaskCallbackKind::ProvidePriorValue, ruleInfo.keyID);
      TaskInterface iface{this, task};
      task->providePriorValue(iface, ruleInfo.result.value);
    }

    // If this task has no waiters, schedule it immediately for finalization.
    if (!taskInfo->waitCount) {
      readyTaskInfos.push_back(taskInfo);
    }

    return false;
  }